

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O0

void jsonip::grammar::double_::
     process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state,
               pair<const_char_*,_long> *mp)

{
  int left;
  char *p;
  semantic_state *this;
  double d_00;
  double d;
  string s;
  pair<const_char_*,_long> *mp_local;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  s.field_2._8_8_ = mp;
  parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::to_string_abi_cxx11_
            ((string *)&d,state,mp->first,mp->second);
  p = (char *)std::__cxx11::string::data();
  left = std::__cxx11::string::size();
  d_00 = parser::parse_double(p,left);
  this = parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::semantic_state(state);
  semantic_state::new_double(this,d_00);
  std::__cxx11::string::~string((string *)&d);
  return;
}

Assistant:

static inline void process_match (S& state, match_pair const& mp)
        {
            const std::string s = state.to_string(mp.first, mp.second);
            const double d = parse_double (s.data(), s.size());
            state.semantic_state().new_double(d);
        }